

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

void NULLC::ArrayCopy(NULLCAutoArray dst,NULLCAutoArray src)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  uint in_stack_00000008;
  undefined4 in_stack_0000000c;
  
  if (CONCAT44(dst.typeID,in_stack_0000000c) != CONCAT44(src.typeID,dst.len)) {
    if (in_stack_00000008 == dst.ptr._4_4_) {
      if ((uint)dst.ptr < (uint)src.ptr) {
        nullcThrowError("ERROR: destination array size \'%d\' is smaller than source array size \'%d\'"
                        ,(ulong)(uint)dst.ptr,(ulong)(uint)src.ptr);
      }
      else if ((uint)src.ptr != 0) {
        uVar1 = nullcGetTypeSize(in_stack_00000008);
        memcpy((void *)CONCAT44(dst.typeID,in_stack_0000000c),(void *)CONCAT44(src.typeID,dst.len),
               (ulong)(uVar1 * (uint)src.ptr));
      }
    }
    else {
      pcVar2 = nullcGetTypeName(in_stack_00000008);
      pcVar3 = nullcGetTypeName(dst.ptr._4_4_);
      nullcThrowError("ERROR: destination element type \'%s\' doesn\'t match source element type \'%s\'"
                      ,pcVar2,pcVar3);
    }
  }
  return;
}

Assistant:

void NULLC::ArrayCopy(NULLCAutoArray dst, NULLCAutoArray src)
{
	if(dst.ptr == src.ptr)
		return;

	if(dst.typeID != src.typeID)
	{
		nullcThrowError("ERROR: destination element type '%s' doesn't match source element type '%s'", nullcGetTypeName(dst.typeID), nullcGetTypeName(src.typeID));
		return;
	}
	if(dst.len < src.len)
	{
		nullcThrowError("ERROR: destination array size '%d' is smaller than source array size '%d'", dst.len, src.len);
		return;
	}

	if(src.len == 0)
		return;

	memcpy(dst.ptr, src.ptr, unsigned(nullcGetTypeSize(dst.typeID) * src.len));
}